

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# history.c
# Opt level: O1

void history_def_delete(history_t *h,HistEvent *ev,hentry_t_conflict *hp)

{
  history_t *phVar1;
  long lVar2;
  
  if ((history_t *)ev != h) {
    if ((h->cursor == (hentry_t_conflict *)ev) &&
       (phVar1 = *(history_t **)(ev + 2), h->cursor = &phVar1->list, phVar1 == h)) {
      h->cursor = (hentry_t_conflict *)ev[1].str;
    }
    lVar2 = *(long *)(ev + 2);
    *(char **)(lVar2 + 0x18) = ev[1].str;
    *(long *)(ev[1].str + 0x20) = lVar2;
    free(ev->str);
    free(ev);
    h->cur = h->cur + -1;
    return;
  }
  abort();
}

Assistant:

static void
history_def_delete(history_t *h,
		   TYPE(HistEvent) *ev __attribute__((__unused__)), hentry_t *hp)
{
	HistEventPrivate *evp = (void *)&hp->ev;
	if (hp == &h->list)
		abort();
	if (h->cursor == hp) {
		h->cursor = hp->prev;
		if (h->cursor == &h->list)
			h->cursor = hp->next;
	}
	hp->prev->next = hp->next;
	hp->next->prev = hp->prev;
	h_free(evp->str);
	h_free(hp);
	h->cur--;
}